

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O0

bool duckdb::HugeintTryCastInteger<unsigned_char,false>(hugeint_t input,uchar *result)

{
  byte bVar1;
  undefined1 *in_RDX;
  long in_RSI;
  ulong in_RDI;
  bool local_1;
  
  if (in_RSI == -1) {
    local_1 = false;
  }
  else if ((in_RSI == 0) && (bVar1 = NumericLimits<unsigned_char>::Maximum(), in_RDI <= bVar1)) {
    *in_RDX = (char)in_RDI;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool HugeintTryCastInteger(hugeint_t input, DST &result) {
	switch (input.upper) {
	case 0:
		// positive number: check if the positive number is in range
		if (input.lower <= uint64_t(NumericLimits<DST>::Maximum())) {
			result = DST(input.lower);
			return true;
		}
		break;
	case -1:
		if (!SIGNED) {
			return false;
		}
		// negative number: check if the negative number is in range
		if (input.lower >= NumericLimits<uint64_t>::Maximum() - uint64_t(NumericLimits<DST>::Maximum())) {
			result = -DST(NumericLimits<uint64_t>::Maximum() - input.lower) - 1;
			return true;
		}
		break;
	default:
		break;
	}
	return false;
}